

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O2

int send_packet(packet *p,char *why)

{
  mbedtls_net_context *ctx;
  int iVar1;
  uint uVar2;
  uchar buf [18432];
  uchar auStack_4838 [18440];
  
  ctx = p->dst;
  if ((opt_9 != 0) && (iVar1 = strcmp(p->type,"ApplicationData"), iVar1 == 0)) {
    uVar2 = p->len;
    memcpy(auStack_4838,p->buf,(ulong)uVar2);
    auStack_4838[uVar2 - 1] = auStack_4838[uVar2 - 1] + '\x01';
    print_packet(p,"corrupted");
    uVar2 = mbedtls_net_send(ctx,auStack_4838,(ulong)p->len);
    if ((int)uVar2 < 1) goto LAB_0010251e;
  }
  print_packet(p,why);
  uVar2 = mbedtls_net_send(ctx,p->buf,(ulong)p->len);
  if (0 < (int)uVar2) {
    if (opt_4 == 0) {
      return 0;
    }
    iVar1 = strcmp(p->type,"ApplicationData");
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = rand();
    if (iVar1 % opt_4 != 0) {
      return 0;
    }
    print_packet(p,"duplicated");
    uVar2 = mbedtls_net_send(ctx,p->buf,(ulong)p->len);
    if (0 < (int)uVar2) {
      return 0;
    }
    printf("  ! mbedtls_net_send returned %d\n",(ulong)uVar2);
    return uVar2;
  }
LAB_0010251e:
  printf("  ! mbedtls_net_send returned %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

int send_packet( const packet *p, const char *why )
{
    int ret;
    mbedtls_net_context *dst = p->dst;

    /* insert corrupted ApplicationData record? */
    if( opt.bad_ad &&
        strcmp( p->type, "ApplicationData" ) == 0 )
    {
        unsigned char buf[MAX_MSG_SIZE];
        memcpy( buf, p->buf, p->len );
        ++buf[p->len - 1];

        print_packet( p, "corrupted" );
        if( ( ret = mbedtls_net_send( dst, buf, p->len ) ) <= 0 )
        {
            mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
            return( ret );
        }
    }

    print_packet( p, why );
    if( ( ret = mbedtls_net_send( dst, p->buf, p->len ) ) <= 0 )
    {
        mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
        return( ret );
    }

    /* Don't duplicate Application Data, only handshake covered */
    if( opt.duplicate != 0 &&
        strcmp( p->type, "ApplicationData" ) != 0 &&
        rand() % opt.duplicate == 0 )
    {
        print_packet( p, "duplicated" );

        if( ( ret = mbedtls_net_send( dst, p->buf, p->len ) ) <= 0 )
        {
            mbedtls_printf( "  ! mbedtls_net_send returned %d\n", ret );
            return( ret );
        }
    }

    return( 0 );
}